

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O3

date_t duckdb::TimeBucket::OffsetWidthConvertibleToMicrosTernaryOperator::
       Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>
                 (interval_t bucket_width,date_t ts,interval_t offset)

{
  bool bVar1;
  int64_t right;
  timestamp_t tVar2;
  int64_t left;
  long lVar3;
  int64_t extraout_RDX;
  long right_00;
  long left_00;
  undefined1 auVar4 [12];
  interval_t iVar5;
  undefined1 auVar6 [16];
  date_t result;
  timestamp_t local_60;
  string local_58;
  interval_t local_38;
  
  local_38.micros = bucket_width.micros;
  local_38._0_8_ = bucket_width._0_8_;
  bVar1 = Value::IsFinite<duckdb::date_t>(ts);
  if (bVar1) {
    right = Interval::GetMicro(&local_38);
    bVar1 = TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(ts,&local_60,false);
    if (!bVar1) {
      auVar4 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
                (&local_58,(duckdb *)(ulong)(uint)ts.days,(date_t)auVar4._8_4_);
      InvalidInputException::InvalidInputException(auVar4._0_8_,&local_58);
      __cxa_throw(auVar4._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    tVar2.value._4_4_ = local_60.value._4_4_;
    tVar2.value._0_4_ = (int32_t)local_60.value;
    iVar5.micros = extraout_RDX;
    iVar5.months = (int)offset.micros;
    iVar5.days = (int)((ulong)offset.micros >> 0x20);
    iVar5 = Interval::Invert(offset._0_8_,iVar5);
    tVar2 = Interval::Add(tVar2,iVar5);
    left = Timestamp::GetEpochMicroSeconds(tVar2);
    right_00 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x35d2976e6a000)) % SEXT816(right),0);
    lVar3 = SubtractOperatorOverflowCheck::Operation<long,long,long>(left,right_00);
    left_00 = lVar3 - lVar3 % right;
    if (lVar3 % right != 0 && lVar3 < 0) {
      left_00 = SubtractOperatorOverflowCheck::Operation<long,long,long>(left_00,right);
    }
    tVar2 = Timestamp::FromEpochMicroSeconds(left_00 + right_00);
    tVar2 = Interval::Add(tVar2,offset);
    bVar1 = TryCast::Operation<duckdb::timestamp_t,duckdb::date_t>(tVar2,(date_t *)&local_60,false);
    if (!bVar1) {
      auVar6 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::date_t>
                (&local_58,(duckdb *)tVar2.value,(timestamp_t)auVar6._8_8_);
      InvalidInputException::InvalidInputException(auVar6._0_8_,&local_58);
      __cxa_throw(auVar6._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  else {
    bVar1 = TryCast::Operation<duckdb::date_t,duckdb::date_t>(ts,(date_t *)&local_60,false);
    if (!bVar1) {
      auVar4 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::date_t>
                (&local_58,(duckdb *)(ulong)(uint)ts.days,(date_t)auVar4._8_4_);
      InvalidInputException::InvalidInputException(auVar4._0_8_,&local_58);
      __cxa_throw(auVar4._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  return (date_t)(int32_t)local_60.value;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC offset) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int64_t bucket_width_micros = Interval::GetMicro(bucket_width);
			int64_t ts_micros = Timestamp::GetEpochMicroSeconds(
			    Interval::Add(Cast::template Operation<TB, timestamp_t>(ts), Interval::Invert(offset)));
			return Cast::template Operation<timestamp_t, TR>(Interval::Add(
			    WidthConvertibleToMicrosCommon(bucket_width_micros, ts_micros, DEFAULT_ORIGIN_MICROS), offset));
		}